

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 80off.cpp
# Opt level: O0

void convertFile(string *inputfilename,string *outputfilename)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *pMVar5;
  void *__buf;
  int local_a0;
  int j;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  MidiFile midifile;
  string *outputfilename_local;
  string *inputfilename_local;
  
  midifile._104_8_ = outputfilename;
  smf::MidiFile::MidiFile((MidiFile *)local_88,inputfilename);
  local_8c = 0;
  while( true ) {
    uVar2 = smf::MidiFile::getTrackCount((MidiFile *)local_88);
    if ((int)uVar2 <= local_8c) break;
    for (local_a0 = 0; iVar3 = smf::MidiFile::getEventCount((MidiFile *)local_88,local_8c),
        local_a0 < iVar3; local_a0 = local_a0 + 1) {
      pMVar4 = smf::MidiFile::operator[]((MidiFile *)local_88,local_8c);
      pMVar5 = smf::MidiEventList::operator[](pMVar4,local_a0);
      bVar1 = smf::MidiMessage::isNoteOff(&pMVar5->super_MidiMessage);
      if (bVar1) {
        pMVar4 = smf::MidiFile::operator[]((MidiFile *)local_88,local_8c);
        pMVar5 = smf::MidiEventList::operator[](pMVar4,local_a0);
        smf::MidiMessage::setCommandNibble(&pMVar5->super_MidiMessage,0x80);
      }
    }
    local_8c = local_8c + 1;
  }
  smf::MidiFile::write((MidiFile *)local_88,midifile._104_4_,__buf,(ulong)uVar2);
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return;
}

Assistant:

void convertFile(const string& inputfilename, const string& outputfilename) {
   MidiFile midifile(inputfilename);
   for (int i=0; i<midifile.getTrackCount(); i++) {
      for (int j=0; j<midifile.getEventCount(i); j++) {
         if (!midifile[i][j].isNoteOff()) {
            continue;
         }
         midifile[i][j].setCommandNibble(0x80);
      }
   }
   midifile.write(outputfilename);
}